

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIICommandDefinitions
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title)

{
  pointer pNVar1;
  string *psVar2;
  size_t initialSkipCount;
  pointer pRVar3;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string str;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  string *local_40;
  pointer local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  pRVar3 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = title;
  local_40 = __return_storage_ptr__;
  if (pRVar3 != local_38) {
    do {
      pNVar1 = (pRVar3->commands).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__v = (pRVar3->commands).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_start; __v != pNVar1; __v = __v + 1) {
        pVar4 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)listedCommands,&__v->name);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          initialSkipCount = determineInitialSkipCount(this,&__v->name);
          generateRAIIHandleCommand(&local_88,this,&__v->name,initialSkipCount,true);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_68,local_88._M_dataplus._M_p,local_88._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != local_38);
  }
  psVar2 = local_40;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  addTitleAndProtection(local_40,this,local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string VulkanHppGenerator::generateRAIICommandDefinitions( std::vector<RequireData> const & requireData,
                                                                std::set<std::string> &          listedCommands,
                                                                std::string const &              title ) const
{
  std::string str;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        str += generateRAIIHandleCommand( command.name, determineInitialSkipCount( command.name ), true );
      }
    }
  }
  return addTitleAndProtection( title, str );
}